

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

type fmt::v5::
     visit_format_arg<fmt::v5::arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>,fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,char>>
               (arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                *vis,basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
                     *arg)

{
  handle handle;
  basic_string_view<char> value;
  custom_value<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RSI;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_RDI;
  type tVar1;
  type tVar2;
  unsigned_long_long in_stack_fffffffffffffeb8;
  uint value_00;
  arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_fffffffffffffec0;
  uint7 uVar3;
  undefined1 uVar4;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_fffffffffffffed0;
  undefined1 in_stack_fffffffffffffed8;
  undefined6 in_stack_fffffffffffffed9;
  char in_stack_fffffffffffffedf;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_fffffffffffffee0;
  char_type *in_stack_fffffffffffffee8;
  undefined1 in_stack_fffffffffffffef0;
  undefined7 in_stack_fffffffffffffef1;
  char *in_stack_fffffffffffffef8;
  size_t in_stack_ffffffffffffff00;
  undefined2 in_stack_ffffffffffffff08;
  arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
  *in_stack_ffffffffffffff10;
  basic_string_view<char> local_c0 [11];
  size_t local_10;
  char local_8;
  
  uVar3 = (uint7)*(uint *)&in_RSI[1].value;
  uVar4 = 0;
  value_00 = (uint)(in_stack_fffffffffffffeb8 >> 0x20);
  switch(uVar3) {
  case 0:
  default:
switchD_00288ba4_default:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
            ::operator()(in_RDI);
    local_8 = tVar1.blackhole_;
    break;
  case 1:
    goto switchD_00288ba4_default;
  case 2:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(&in_stack_fffffffffffffec0->
                          super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                         ,value_00);
    local_8 = tVar1.blackhole_;
    break;
  case 3:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(&in_stack_fffffffffffffec0->
                          super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                         ,value_00);
    local_8 = tVar1.blackhole_;
    break;
  case 4:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(&in_stack_fffffffffffffec0->
                          super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                         ,in_stack_fffffffffffffeb8);
    local_8 = tVar1.blackhole_;
    break;
  case 5:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(&in_stack_fffffffffffffec0->
                          super_arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                         ,in_stack_fffffffffffffeb8);
    local_8 = tVar1.blackhole_;
    break;
  case 6:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(in_stack_fffffffffffffed0,false);
    local_8 = tVar1.blackhole_;
    break;
  case 7:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(in_stack_fffffffffffffee0,in_stack_fffffffffffffedf);
    local_8 = tVar1.blackhole_;
    break;
  case 8:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(in_stack_fffffffffffffee0,
                         (double)CONCAT17(in_stack_fffffffffffffedf,
                                          CONCAT61(in_stack_fffffffffffffed9,
                                                   in_stack_fffffffffffffed8)));
    local_8 = tVar1.blackhole_;
    break;
  case 9:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,char>>
            ::operator()(in_stack_ffffffffffffff10,
                         (longdouble)CONCAT28(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00));
    local_8 = tVar1.blackhole_;
    break;
  case 10:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                          *)CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0),
                         in_stack_fffffffffffffee8);
    local_8 = tVar1.blackhole_;
    break;
  case 0xb:
    basic_string_view<char>::basic_string_view
              (local_c0,(char *)in_RSI->value,(size_t)in_RSI->format);
    value.size_ = in_stack_ffffffffffffff00;
    value.data_ = in_stack_fffffffffffffef8;
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
            ::operator()((arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
                          *)CONCAT71(in_stack_fffffffffffffef1,in_stack_fffffffffffffef0),value);
    local_8 = tVar1.blackhole_;
    break;
  case 0xc:
    tVar1 = internal::
            arg_formatter_base<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
            ::operator()(in_stack_fffffffffffffed0,(void *)(ulong)uVar3);
    local_8 = tVar1.blackhole_;
    break;
  case 0xd:
    basic_format_arg<fmt::v5::basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_>
    ::handle::handle((handle *)&stack0xffffffffffffff10,*in_RSI);
    handle.custom_.value._7_1_ = uVar4;
    handle.custom_.value._0_7_ = uVar3;
    handle.custom_.format =
         (_func_void_void_ptr_basic_format_context<fmt::v5::internal::counting_iterator<char>,_char>_ptr
          *)in_stack_fffffffffffffed0;
    tVar1 = arg_formatter<fmt::v5::output_range<fmt::v5::internal::counting_iterator<char>,_char>_>
            ::operator()(in_stack_fffffffffffffec0,handle);
    local_8 = tVar1.blackhole_;
  }
  local_10 = tVar1.count_;
  tVar2._9_7_ = tVar1._9_7_;
  tVar2.blackhole_ = local_8;
  tVar2.count_ = local_10;
  return tVar2;
}

Assistant:

FMT_CONSTEXPR typename internal::result_of<Visitor(int)>::type
    visit_format_arg(Visitor &&vis, const basic_format_arg<Context> &arg) {
  typedef typename Context::char_type char_type;
  switch (arg.type_) {
  case internal::none_type:
    break;
  case internal::named_arg_type:
    FMT_ASSERT(false, "invalid argument type");
    break;
  case internal::int_type:
    return vis(arg.value_.int_value);
  case internal::uint_type:
    return vis(arg.value_.uint_value);
  case internal::long_long_type:
    return vis(arg.value_.long_long_value);
  case internal::ulong_long_type:
    return vis(arg.value_.ulong_long_value);
  case internal::bool_type:
    return vis(arg.value_.int_value != 0);
  case internal::char_type:
    return vis(static_cast<char_type>(arg.value_.int_value));
  case internal::double_type:
    return vis(arg.value_.double_value);
  case internal::long_double_type:
    return vis(arg.value_.long_double_value);
  case internal::cstring_type:
    return vis(arg.value_.string.value);
  case internal::string_type:
    return vis(basic_string_view<char_type>(
                 arg.value_.string.value, arg.value_.string.size));
  case internal::pointer_type:
    return vis(arg.value_.pointer);
  case internal::custom_type:
    return vis(typename basic_format_arg<Context>::handle(arg.value_.custom));
  }
  return vis(monostate());
}